

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_string.cc
# Opt level: O0

void SplitStringUsing(string *full,char *delim,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *result)

{
  ostream *poVar1;
  ostream *poVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  Logger *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  int line;
  string *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  LogSeverity severity;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator local_41;
  string local_40 [36];
  Logger local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  long local_10;
  
  severity = (LogSeverity)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  if (in_RSI == 0) {
    local_10 = in_RSI;
    Logger::Logger(&local_1c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff88,"SplitStringUsing",
               (allocator *)&stack0xffffffffffffff87);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffef8,line,in_stack_fffffffffffffee8);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x34);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"delim != NULL");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10 != 0);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger(in_stack_fffffffffffffe80);
    abort();
  }
  local_18 = in_RDX;
  if (in_RDX == (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    Logger::Logger((Logger *)&stack0xffffffffffffff80,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
               ,&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"SplitStringUsing",&local_c9);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffef8,line,in_stack_fffffffffffffee8);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/split_string.cc"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x35);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"result != NULL");
    poVar1 = std::operator<<(poVar1," = ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar1,local_18 !=
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)0x0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    Logger::~Logger((Logger *)poVar1);
    abort();
  }
  CalculateReserveForVector(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::back_insert_iterator(&local_d8,local_18);
  SplitStringToIteratorUsing<std::__cxx11::string,back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  return;
}

Assistant:

void SplitStringUsing(const std::string& full,
                      const char* delim,
                      std::vector<std::string>* result) {
  CHECK(delim != NULL);
  CHECK(result != NULL);
  result->reserve(CalculateReserveForVector(full, delim));
  back_insert_iterator< std::vector<std::string> > it(*result);
  SplitStringToIteratorUsing(full, delim, it);
}